

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O3

void __thiscall
Projection::initialVelocityProject
          (Projection *this,int c_lev,Real cur_divu_time,int have_divu,int init_vel_iter)

{
  FabArray<amrex::FArrayBox> *pFVar1;
  pointer ppAVar2;
  AmrLevel *pAVar3;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar4;
  long lVar5;
  FabArrayBase *pFVar6;
  char cVar7;
  pointer puVar8;
  bool bVar9;
  int nlevel;
  uint ngrow;
  TimeCenter TVar10;
  long lVar11;
  MultiFab *pMVar12;
  NavierStokesBase *this_00;
  int iVar13;
  int iVar14;
  pointer puVar15;
  MultiFab *pMVar16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar17;
  undefined8 extraout_RDX_08;
  int iVar18;
  int iVar19;
  long lVar20;
  undefined8 *puVar21;
  double dVar22;
  Real RVar23;
  int Divu_Type;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  sig;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  int Divu;
  MFIter mfi;
  int local_2a0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_298;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_278;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_258;
  _func_int **local_238;
  undefined1 local_230 [32];
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_210;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  element_type *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  element_type *local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  ostream *local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1a8;
  uint local_190;
  _Bit_pointer local_178;
  
  iVar18 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  local_230._28_4_ = init_vel_iter;
  local_1c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cur_divu_time;
  if (init_vel_iter < 1) {
    if (c_lev <= iVar18) {
      lVar11 = (long)c_lev;
      iVar18 = (iVar18 - c_lev) + 1;
      do {
        pFVar1 = *(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar11]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x1b0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                   &(pFVar1->super_FabArrayBase).n_grow);
        pFVar1 = *(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar11]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x290);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                   &(pFVar1->super_FabArrayBase).n_grow);
        lVar11 = lVar11 + 1;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    if (verbose != 0) {
      local_1b0 = amrex::OutStream();
      local_1b8._M_pi._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_1b8._M_pi._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
      *(undefined8 *)
       ((long)&vStack_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_1a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_1a8,
                 "Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n"
                 ,0x53);
      amrex::Print::~Print((Print *)&local_1b8);
    }
  }
  else {
    if (verbose != 0) {
      local_1b0 = amrex::OutStream();
      local_1b8._M_pi._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      local_1b8._M_pi._0_4_ = *(int *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
      *(undefined8 *)
       ((long)&vStack_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_1a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_1a8,"Projection::initialVelocityProject(): levels = ",0x2f);
      std::ostream::operator<<((ostringstream *)&vStack_1a8,c_lev);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8,"-",1);
      std::ostream::operator<<((ostringstream *)&vStack_1a8,iVar18);
      local_230[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8,local_230,1);
      amrex::Print::~Print((Print *)&local_1b8);
      if (rho_wgt_vel_proj == 0) {
        local_1b0 = amrex::OutStream();
        local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
        *(undefined8 *)
         ((long)&vStack_1a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_1a8,"CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n",0x2d);
      }
      else {
        local_1b0 = amrex::OutStream();
        local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
        *(undefined8 *)
         ((long)&vStack_1a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_1a8,"RHO WEIGHTED INITIAL VELOCITY PROJECTION\n",0x29);
      }
      amrex::Print::~Print((Print *)&local_1b8);
      if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
        amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
      }
    }
    local_1d8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)amrex::ParallelDescriptor::second();
    local_238 = (_func_int **)operator_new(0x50);
    local_230._8_8_ = local_238 + 10;
    local_238[8] = (_func_int *)0x0;
    local_238[9] = (_func_int *)0x0;
    local_238[6] = (_func_int *)0x0;
    local_238[7] = (_func_int *)0x0;
    local_238[4] = (_func_int *)0x0;
    local_238[5] = (_func_int *)0x0;
    local_238[2] = (_func_int *)0x0;
    local_238[3] = (_func_int *)0x0;
    *local_238 = (_func_int *)0x0;
    local_238[1] = (_func_int *)0x0;
    local_230._0_8_ = local_238;
    local_230._16_8_ = local_230._8_8_;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_start + 10;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[8] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[9] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[6] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[7] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[4] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[5] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[3] = (MultiFab *)0x0;
    *local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
     super__Vector_impl_data._M_start = (MultiFab *)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_278.
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 10;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[8]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    ((local_278.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
    nlevel = (iVar18 - c_lev) + 1;
    lVar11 = (long)c_lev;
    iVar13 = iVar18 + 1;
    iVar14 = iVar13 - c_lev;
    local_1d0 = (element_type *)(lVar11 * 8);
    local_2a0 = 0;
    local_278.
    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_278.
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (verbose != 0) {
        local_1b0 = amrex::OutStream();
        local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
        *(undefined8 *)
         ((long)&vStack_1a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
        cVar7 = (char)(ostringstream *)&vStack_1a8;
        std::ios::widen((char)vStack_1a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar7
                       );
        std::ostream::put(cVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_1a8,"Projection::initialVelocityProject(): iteration ",0x30);
        std::ostream::operator<<((ostringstream *)&vStack_1a8,local_2a0);
        std::ios::widen((char)vStack_1a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar7
                       );
        std::ostream::put(cVar7);
        std::ostream::flush();
        amrex::Print::~Print((Print *)&local_1b8);
      }
      lVar20 = lVar11;
      iVar19 = iVar14;
      if (c_lev <= iVar18) {
        do {
          pFVar1 = *(FabArray<amrex::FArrayBox> **)
                    (*(long *)&((this->LevelData).
                                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                    + 0x1b0);
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                     &(pFVar1->super_FabArrayBase).n_grow);
          iVar19 = iVar19 + -1;
          lVar20 = lVar20 + 1;
        } while (iVar19 != 0);
      }
      bVar9 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      bVar9 = (have_divu != 0 && bVar9) && do_outflow_bcs != 0;
      ngrow = (uint)bVar9;
      if (c_lev <= iVar18) {
        local_1c0 = (element_type *)
                    local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        lVar20 = lVar11;
        do {
          puVar15 = local_278.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_238[lVar20] =
               *(_func_int **)
                (*(long *)&((this->LevelData).
                            super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> +
                200);
          (&(local_1c0->m_pmap).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start)
          [lVar20] = (pointer)*(MultiFab **)
                               (*(long *)&((this->LevelData).
                                           super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                           .
                                           super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar20]->state)
                                          .
                                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                          .
                                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                               + 0x1b0);
          ppAVar2 = (this->LevelData).
                    super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                    super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pAVar3 = ppAVar2[lVar20];
          pMVar12 = (MultiFab *)operator_new(0x180);
          local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
          vStack_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b0 = (ostream *)0x0;
          vStack_1a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          amrex::MultiFab::MultiFab
                    (pMVar12,&pAVar3->grids,&pAVar3->dmap,1,ngrow,(MFInfo *)&local_1b8,
                     (FabFactory<amrex::FArrayBox> *)
                     (ppAVar2[lVar20]->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    );
          pMVar16 = puVar15[lVar20]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
          puVar15[lVar20]._M_t.
          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar12;
          if (pMVar16 != (MultiFab *)0x0) {
            (**(code **)(*(long *)&(pMVar16->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                        8))();
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_1a8);
          if (rho_wgt_vel_proj == 0) {
            pFVar1 = &(local_278.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>;
            local_1b8._M_pi._4_1_ = bVar9;
            local_1b8._M_pi._0_4_ = ngrow;
            local_1b8._M_pi._5_3_ = 0;
            local_1b0 = (ostream *)CONCAT44(local_1b0._4_4_,ngrow);
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar1,1.0,0,(pFVar1->super_FabArrayBase).n_comp,(IntVect *)&local_1b8);
          }
          else {
            if (ngrow != 0) {
              amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                        (*(FabArray<amrex::FArrayBox> **)
                          (*(long *)&((this->LevelData).
                                      super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                      .
                                      super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                     .
                                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                          + 200),1e+200,3,1);
              uVar4._M_t.
              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
              super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                   (this->parent->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t;
              lVar5 = *(long *)((long)uVar4._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                               + 0x170);
              pFVar6 = *(FabArrayBase **)(lVar5 + 200);
              TVar10 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar5 + 8));
              if (TVar10 == Point) {
                dVar22 = *(double *)(lVar5 + 0xb0);
              }
              else {
                dVar22 = (*(double *)(lVar5 + 0xa8) + *(double *)(lVar5 + 0xb0)) * 0.5;
              }
              amrex::MFIter::MFIter((MFIter *)&local_1b8,pFVar6,'\0');
              while ((int)vStack_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage < (int)local_190) {
                iVar19 = (int)vStack_1a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_178 != (_Bit_pointer)0x0) {
                  iVar19 = *(int *)(*local_178 +
                                   (long)(int)vStack_1a8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage * 4
                                   );
                }
                (**(code **)(*(long *)uVar4._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                            + 0xf0))
                          (dVar22,uVar4._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                           *(undefined8 *)
                            (*(long *)((long)&pFVar6[1].boxarray.m_bat.m_op + 0xc) +
                            (long)iVar19 * 8),0,3,3,1);
                amrex::MFIter::operator++((MFIter *)&local_1b8);
              }
              amrex::MFIter::~MFIter((MFIter *)&local_1b8);
            }
            amrex::MultiFab::Copy
                      (local_278.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       *(MultiFab **)
                        (*(long *)&((this->LevelData).
                                    super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    .
                                    super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                   .
                                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                        + 200),3,0,1,ngrow);
          }
          lVar20 = lVar20 + 1;
        } while (iVar13 != (int)lVar20);
      }
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
      puVar15 = local_258.
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 10;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[8]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      ((local_258.
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
      lVar20 = lVar11;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar15;
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar15;
      if (c_lev <= iVar18) {
        do {
          amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)local_238[lVar20],1e+200,0,3);
          uVar4._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
          _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->parent->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t;
          lVar5 = *(long *)((long)uVar4._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0x170);
          pFVar6 = *(FabArrayBase **)(lVar5 + 200);
          TVar10 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar5 + 8));
          if (TVar10 == Point) {
            dVar22 = *(double *)(lVar5 + 0xb0);
          }
          else {
            dVar22 = (*(double *)(lVar5 + 0xa8) + *(double *)(lVar5 + 0xb0)) * 0.5;
          }
          amrex::MFIter::MFIter((MFIter *)&local_1b8,pFVar6,'\0');
          while ((int)vStack_1a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage < (int)local_190) {
            iVar19 = (int)vStack_1a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_178 != (_Bit_pointer)0x0) {
              iVar19 = *(int *)(*local_178 +
                               (long)(int)vStack_1a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage * 4);
            }
            puVar15 = (pointer)0x0;
            (**(code **)(*(long *)uVar4._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0xf0))(dVar22,uVar4._M_t.
                                      super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                      .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                               *(undefined8 *)
                                (*(long *)((long)&pFVar6[1].boxarray.m_bat.m_op + 0xc) +
                                (long)iVar19 * 8),0,0,0,3);
            amrex::MFIter::operator++((MFIter *)&local_1b8);
          }
          amrex::MFIter::~MFIter((MFIter *)&local_1b8);
          if (have_divu != 0) {
            local_1b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&vStack_1a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"divu","");
            bVar9 = amrex::AmrLevel::isStateVariable
                              ((string *)&local_1b8,(int *)&local_298,(int *)&local_1f8);
            if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&vStack_1a8) {
              operator_delete(local_1b8._M_pi,
                              (ulong)((long)&((vStack_1a8.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + 1));
            }
            if (!bVar9) {
              amrex::Error_host("Projection::initialVelocityProject(): Divu not found");
            }
            puVar15 = (pointer)0x0;
            this_00 = (NavierStokesBase *)
                      __dynamic_cast((this->LevelData).
                                     super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                     .
                                     super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar20],
                                     &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo,0);
            puVar8 = local_258.
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar12 = NavierStokesBase::getDivCond(this_00,ngrow,(Real)local_1c8._M_pi);
            pMVar16 = puVar8[lVar20]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
            puVar8[lVar20]._M_t.
            super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar12;
            if (pMVar16 != (MultiFab *)0x0) {
              (**(code **)(*(long *)&(pMVar16->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                          + 8))();
            }
          }
          lVar20 = lVar20 + 1;
        } while (iVar13 != (int)lVar20);
      }
      bVar9 = OutFlowBC::HasOutFlowBC(this->phys_bc);
      pMVar16 = (MultiFab *)CONCAT71((int7)((ulong)puVar15 >> 8),do_outflow_bcs != 0);
      uVar17 = extraout_RDX;
      if ((have_divu != 0) && (bVar9 && do_outflow_bcs != 0)) {
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_258);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  (&local_298,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_278);
        pMVar16 = (MultiFab *)local_230;
        set_outflow_bcs(this,0x3ea,&local_210,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar16,
                        (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                        &local_298,c_lev,iVar18,have_divu);
        uVar17 = extraout_RDX_00;
        if (local_298.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_298.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar17 = extraout_RDX_01;
        }
        if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(local_1b8._M_pi,
                          (long)vStack_1a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_1b8._M_pi);
          uVar17 = extraout_RDX_02;
        }
      }
      lVar20 = lVar11;
      if (iVar18 < c_lev) {
        if (have_divu != 0) goto LAB_00369597;
LAB_00369651:
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_278);
        local_298.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pMVar16 = (MultiFab *)local_230;
        doMLMGNodalProjection
                  (this,c_lev,nlevel,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar16,
                   &local_210,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                   &local_298,&local_1f8,proj_tol,proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0
                   ,false);
        uVar17 = extraout_RDX_06;
      }
      else {
        do {
          scaleVar(this,local_278.
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar17,
                   pMVar16,(int)lVar20);
          lVar20 = lVar20 + 1;
          uVar17 = extraout_RDX_03;
        } while (iVar13 != (int)lVar20);
        if (have_divu == 0) goto LAB_00369651;
        lVar20 = lVar11;
        iVar19 = iVar14;
        if (c_lev <= iVar18) {
          do {
            amrex::MultiFab::mult
                      (local_258.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,-1.0,0,1,ngrow)
            ;
            lVar20 = lVar20 + 1;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
LAB_00369597:
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_278);
        amrex::GetVecOfPtrs<amrex::MultiFab>
                  (&local_298,
                   (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)&local_258);
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pMVar16 = (MultiFab *)local_230;
        doMLMGNodalProjection
                  (this,c_lev,nlevel,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar16,
                   &local_210,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1b8,
                   &local_298,&local_1f8,proj_tol,proj_abs_tol,false,(MultiFab *)0x0,(MultiFab *)0x0
                   ,false);
        uVar17 = extraout_RDX_04;
        if (local_298.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_298.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar17 = extraout_RDX_05;
        }
      }
      if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(local_1b8._M_pi,
                        (long)vStack_1a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)local_1b8._M_pi);
        uVar17 = extraout_RDX_07;
      }
      lVar20 = lVar11;
      if (c_lev <= iVar18) {
        do {
          rescaleVar(this,local_278.
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(int)uVar17,
                     pMVar16,(int)lVar20);
          lVar20 = lVar20 + 1;
          uVar17 = extraout_RDX_08;
        } while (iVar13 != (int)lVar20);
        lVar20 = lVar11;
        iVar19 = iVar14;
        if (c_lev <= iVar18) {
          do {
            pFVar1 = *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&((this->LevelData).
                                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  .
                                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 0x1b0);
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                       &(pFVar1->super_FabArrayBase).n_grow);
            pFVar1 = *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&((this->LevelData).
                                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  .
                                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 0x1a8);
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                       &(pFVar1->super_FabArrayBase).n_grow);
            pFVar1 = *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&((this->LevelData).
                                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  .
                                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 0x290);
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                       &(pFVar1->super_FabArrayBase).n_grow);
            pFVar1 = *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&((this->LevelData).
                                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  .
                                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar20]->state).
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 0x288);
            amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                      (pFVar1,0.0,0,(pFVar1->super_FabArrayBase).n_comp,
                       &(pFVar1->super_FabArrayBase).n_grow);
            lVar20 = lVar20 + 1;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
      }
      if (verbose != 0) {
        local_1b0 = amrex::OutStream();
        local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
        local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
        *(undefined8 *)
         ((long)&vStack_1a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish +
         vStack_1a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
             *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vStack_1a8,"After nodal projection:",0x17);
        cVar7 = (char)(ostringstream *)&vStack_1a8;
        std::ios::widen((char)vStack_1a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar7
                       );
        std::ostream::put(cVar7);
        std::ostream::flush();
        amrex::Print::~Print((Print *)&local_1b8);
        if (c_lev <= iVar18) {
          local_238 = (_func_int **)local_230._0_8_;
          puVar21 = (undefined8 *)(local_230._0_8_ + (long)local_1d0);
          iVar19 = c_lev;
          do {
            local_1b0 = amrex::OutStream();
            local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
            local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
            *(undefined8 *)
             ((long)&vStack_1a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish +
             vStack_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
                 *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8,"  lev ",6);
            std::ostream::operator<<((ostringstream *)&vStack_1a8,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&vStack_1a8,"max(abs(u,v,w)) = ",0x12);
            RVar23 = amrex::MultiFab::norm0((MultiFab *)*puVar21,0,0,false,true);
            std::ostream::_M_insert<double>(RVar23);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8," ",1);
            RVar23 = amrex::MultiFab::norm0((MultiFab *)*puVar21,1,0,false,true);
            std::ostream::_M_insert<double>(RVar23);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_1a8," ",1);
            RVar23 = amrex::MultiFab::norm0((MultiFab *)*puVar21,2,0,false,true);
            std::ostream::_M_insert<double>(RVar23);
            std::ios::widen((char)vStack_1a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length +
                            cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
            amrex::Print::~Print((Print *)&local_1b8);
            iVar19 = iVar19 + 1;
            puVar21 = puVar21 + 1;
          } while (iVar13 != iVar19);
        }
      }
      std::
      vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::~vector(&local_258);
      local_2a0 = local_2a0 + 1;
    } while (local_2a0 != local_230._28_4_);
    if (verbose != 0) {
      dVar22 = amrex::ParallelDescriptor::second();
      local_1b0 = amrex::OutStream();
      local_1b8._M_pi._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._M_pi._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_1a8);
      *(undefined8 *)
       ((long)&vStack_1a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       vStack_1a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
           *(undefined8 *)(local_1b0 + *(long *)(*(long *)local_1b0 + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_1a8,"Projection::initialVelocityProject(): time: ",0x2c);
      std::ostream::_M_insert<double>(dVar22 - (double)local_1d8._M_pi);
      local_258.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_258.
                             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_1a8,(char *)&local_258,1);
      amrex::Print::~Print((Print *)&local_1b8);
    }
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::~vector(&local_278);
    if (local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_func_int **)local_230._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_230._0_8_,local_230._16_8_ - local_230._0_8_);
    }
  }
  return;
}

Assistant:

void
Projection::initialVelocityProject (int  c_lev,
                                    Real cur_divu_time,
                                    int  have_divu,
                                    int init_vel_iter )
{
    int lev;
    int f_lev = parent->finestLevel();

    if ( init_vel_iter <= 0 ){
      // Make sure P_old is initialized
      for (lev = c_lev; lev <= f_lev; lev++)
      {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
      }
      
      if ( verbose ) Print()<<"Returning from initalVelocityProject() without projecting because init_vel_iter<=0\n";
      return;
    }

    if (verbose)
    {
        amrex::Print() << "Projection::initialVelocityProject(): levels = " << c_lev
                       << "-" << f_lev << '\n';
        if (rho_wgt_vel_proj)
            amrex::Print() << "RHO WEIGHTED INITIAL VELOCITY PROJECTION\n";
        else
            amrex::Print() << "CONSTANT DENSITY INITIAL VELOCITY PROJECTION\n";
    }

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real strt_time = ParallelDescriptor::second();

    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);
    Vector<std::unique_ptr<MultiFab> > sig(maxlev);

    for (int iter = 0; iter < init_vel_iter; ++iter)
    {
        if (verbose)
        {
            amrex::Print() << std::endl
                           << "Projection::initialVelocityProject(): iteration "
                           << iter
                           << std::endl;
        }

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.0);
        }

	// MLNodeLaplacian does not take any ghost cells from rhcc or sig.
	// copies only valid cells and fills ghosts internally.
	// However, vel and phi are assumed to have 1 ghost cell in MLMG.
	// set outflow bcs fills vel and phi using 1 ghost cell from sig (holding rho)
	// and rhcc (holding divu)
	const int nghost =
	  (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu) ? 1 : 0;

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
            phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));

            const BoxArray& grids  = LevelData[lev]->boxArray();
            const DistributionMapping& dmap = LevelData[lev]->DistributionMap();
            sig[lev].reset(new MultiFab(grids,dmap,1,nghost,MFInfo(),LevelData[lev]->Factory()));

            if (rho_wgt_vel_proj)
            {
	      if ( nghost > 0 ){
                LevelData[lev]->get_new_data(State_Type).setBndry(BogusValue,Density,1);

                AmrLevel& amr_level = parent->getLevel(lev);

                MultiFab& S_new = amr_level.get_new_data(State_Type);

                Real curr_time = amr_level.get_state_data(State_Type).curTime();

                for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
                {
                    amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,
                                                    Density,Density,1);
                }
	      }

	      MultiFab::Copy(*sig[lev],
			     LevelData[lev]->get_new_data(State_Type),
			     Density, 0, 1, nghost);
            }
            else
            {
                sig[lev]->setVal(1.,nghost);
            }
        }

        Vector<std::unique_ptr<MultiFab> > rhcc(maxlev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
            //
            // Set the physical boundary values.
            //
            AmrLevel& amr_level = parent->getLevel(lev);

            MultiFab& S_new = amr_level.get_new_data(State_Type);

            Real curr_time = amr_level.get_state_data(State_Type).curTime();

            for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
            }

            if (have_divu)
            {
                int Divu_Type, Divu;
                if (!LevelData[lev]->isStateVariable("divu", Divu_Type, Divu))
		  amrex::Error("Projection::initialVelocityProject(): Divu not found");

		NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev]);
		AMREX_ASSERT(!(ns == 0));

		rhcc[lev].reset(ns->getDivCond(nghost,cur_divu_time));
            }
        }

        if (OutFlowBC::HasOutFlowBC(phys_bc) && do_outflow_bcs && have_divu)
        {
            set_outflow_bcs(INITIAL_VEL,phi,vel,
                            amrex::GetVecOfPtrs(rhcc),
                            amrex::GetVecOfPtrs(sig),
                            c_lev,f_lev,have_divu);
        }

        //
        // Scale the projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            scaleVar(sig[lev].get(),nghost,vel[lev],lev);
        }

        //
        // Project
        //
        //

        bool increment_gp = false;
        if (!have_divu)
        {
            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  {},
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }
        else
        {
            for (lev = c_lev; lev <= f_lev; lev++)
            {
                if (parent->Geom(0).IsRZ()) radMultScal(lev,*rhcc[lev]);
                rhcc[lev]->mult(-1.0,0,1,nghost);
            }

            doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi,
                                  amrex::GetVecOfPtrs(sig),
                                  amrex::GetVecOfPtrs(rhcc),
                                  {},
                                  proj_tol, proj_abs_tol, increment_gp, 0, 0);
        }

        //
        // Unscale initial projection variables.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
            rescaleVar(sig[lev].get(),nghost,vel[lev],lev);

        for (lev = c_lev; lev <= f_lev; lev++)
        {
            LevelData[lev]->get_old_data(Press_Type).setVal(0.);
            LevelData[lev]->get_new_data(Press_Type).setVal(0.);

            LevelData[lev]->get_old_data(Gradp_Type).setVal(0.);
            LevelData[lev]->get_new_data(Gradp_Type).setVal(0.);
        }

        if (verbose)
        {
            amrex::Print() << "After nodal projection:" << std::endl;
            for (lev = c_lev; lev <= f_lev; ++lev)
            {
                amrex::Print() << "  lev " << lev << ": "
#if (AMREX_SPACEDIM==3)
                               << "max(abs(u,v,w)) = "
#else
                               << "max(abs(u,v)) = "
#endif
                               << vel[lev]->norm0(0,0,false,true) << " "
                               << vel[lev]->norm0(1,0,false,true) << " "
#if (AMREX_SPACEDIM==3)
                               << vel[lev]->norm0(2,0,false,true)
#endif
                               << std::endl;
            }
        }
    }

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

	amrex::Print() << "Projection::initialVelocityProject(): time: " << run_time << '\n';
    }
}